

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<Data>(QtPromise *this,Data_conflict *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  Data_conflict *local_18;
  Data_conflict *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (Data_conflict *)this;
  QPromise<Data>::
  QPromise<QtPromise::resolve<Data>(Data&&)::_lambda(QtPromise::QPromiseResolve<Data>&&,QtPromise::QPromiseReject<Data>&&)_1_>
            ((QPromise<Data> *)this,&local_20);
  TVar1.super_QPromiseBase<Data>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<Data>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}